

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmLocalGenerator::ExpandCustomCommandOutputPaths
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmCompiledGeneratorExpression *cge,
          string *config)

{
  pointer pbVar1;
  string *psVar2;
  string *p;
  pointer in_path;
  string_view arg;
  undefined1 local_78 [40];
  string local_50;
  
  local_78._8_8_ = 0;
  local_78[0x10] = '\0';
  local_78._0_8_ = local_78 + 0x10;
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (cge,this,config,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                      (string *)local_78);
  arg._M_str = (psVar2->_M_dataplus)._M_p;
  arg._M_len = psVar2->_M_string_length;
  cmExpandedList_abi_cxx11_(__return_storage_ptr__,arg,false);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  in_path = (__return_storage_ptr__->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_path != pbVar1) {
    do {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_78,&(this->super_cmOutputConverter).StateSnapshot);
      psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_78);
      cmsys::SystemTools::CollapseFullPath(&local_50,in_path,psVar2);
      std::__cxx11::string::operator=((string *)in_path,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      in_path = in_path + 1;
    } while (in_path != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmLocalGenerator::ExpandCustomCommandOutputPaths(
  cmCompiledGeneratorExpression const& cge, std::string const& config)
{
  std::vector<std::string> paths = cmExpandedList(cge.Evaluate(this, config));
  for (std::string& p : paths) {
    p = cmSystemTools::CollapseFullPath(p, this->GetCurrentBinaryDirectory());
  }
  return paths;
}